

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3AddDefaultValue(Parse *pParse,Expr *pExpr,char *zStart,char *zEnd)

{
  short sVar1;
  sqlite3 *db;
  Table *pTab;
  Column *pCVar2;
  int iVar3;
  Expr *pExpr_00;
  Column *pCol;
  uint initFlag;
  Expr x;
  
  db = pParse->db;
  pTab = pParse->pNewTable;
  if (pTab != (Table *)0x0) {
    if ((db->init).busy == '\0') {
      initFlag = 4;
    }
    else {
      initFlag = (db->init).iDb == '\x01' ^ 5;
    }
    pCVar2 = pTab->aCol;
    sVar1 = pTab->nCol;
    pCol = pCVar2 + (long)sVar1 + -1;
    iVar3 = exprIsConst(pExpr,initFlag,0);
    if (iVar3 == 0) {
      sqlite3ErrorMsg(pParse,"default value of column [%s] is not constant",pCol->zCnName);
    }
    else if ((pCVar2[(long)sVar1 + -1].colFlags & 0x60) == 0) {
      x.u.zToken = (char *)0x0;
      x.iColumn = 0;
      x.iAgg = 0;
      x.w = (anon_union_4_2_009eaf8f_for_w)0x0;
      x.pAggInfo = (AggInfo *)0x0;
      x.x.pList = (ExprList *)0x0;
      x.nHeight = 0;
      x.iTable = 0;
      x.pLeft = (Expr *)0x0;
      x.pRight = (Expr *)0x0;
      x.y.pTab = (Table *)0x0;
      x.op = 0xb5;
      x.affExpr = '\0';
      x.op2 = '\0';
      x._3_1_ = 0;
      x.flags = 0;
      x.u.zToken = sqlite3DbSpanDup(db,zStart,zEnd);
      x.flags = 0x2000;
      x.pLeft = pExpr;
      pExpr_00 = sqlite3ExprDup(db,&x,1);
      sqlite3DbFree(db,x.u.zToken);
      sqlite3ColumnSetExpr(pParse,pTab,pCol,pExpr_00);
    }
    else {
      sqlite3ErrorMsg(pParse,"cannot use DEFAULT on a generated column");
    }
  }
  if (1 < pParse->eParseMode) {
    sqlite3RenameExprUnmap(pParse,pExpr);
  }
  sqlite3ExprDelete(db,pExpr);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(
  Parse *pParse,           /* Parsing context */
  Expr *pExpr,             /* The parsed expression of the default value */
  const char *zStart,      /* Start of the default value text */
  const char *zEnd         /* First character past end of defaut value text */
){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    int isInit = db->init.busy && db->init.iDb!=1;
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pExpr, isInit) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zCnName);
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( pCol->colFlags & COLFLAG_GENERATED ){
      testcase( pCol->colFlags & COLFLAG_VIRTUAL );
      testcase( pCol->colFlags & COLFLAG_STORED );
      sqlite3ErrorMsg(pParse, "cannot use DEFAULT on a generated column");
#endif
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory.
      */
      Expr x, *pDfltExpr;
      memset(&x, 0, sizeof(x));
      x.op = TK_SPAN;
      x.u.zToken = sqlite3DbSpanDup(db, zStart, zEnd);
      x.pLeft = pExpr;
      x.flags = EP_Skip;
      pDfltExpr = sqlite3ExprDup(db, &x, EXPRDUP_REDUCE);
      sqlite3DbFree(db, x.u.zToken);
      sqlite3ColumnSetExpr(pParse, p, pCol, pDfltExpr);
    }
  }
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprUnmap(pParse, pExpr);
  }
  sqlite3ExprDelete(db, pExpr);
}